

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue_tests.cpp
# Opt level: O0

void __thiscall
CheckQueueTest::Correct_Queue_range
          (CheckQueueTest *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *range)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  reference puVar4;
  size_type sVar5;
  long in_FS_OFFSET;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range1;
  size_t total;
  size_t i;
  iterator __end1;
  iterator __begin1;
  vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> vChecks;
  __single_object small_queue;
  CCheckQueueControl<FakeCheckCheckCompletion> control;
  char *in_stack_fffffffffffffe28;
  CCheckQueue<FakeCheckCheckCompletion> *in_stack_fffffffffffffe30;
  assertion_result *in_stack_fffffffffffffe38;
  CCheckQueueControl<FakeCheckCheckCompletion> *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  lazy_ostream *in_stack_fffffffffffffe50;
  int *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  undefined1 in_stack_fffffffffffffe67;
  lazy_ostream *in_stack_fffffffffffffe68;
  undefined1 local_128 [16];
  undefined1 local_118 [64];
  const_string local_d8;
  assertion_result local_98 [2];
  long local_60;
  unsigned_long local_58;
  undefined8 local_50;
  undefined8 local_48;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<CCheckQueue<FakeCheckCheckCompletion>,unsigned_int_const&,int_const&>
            ((uint *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
             in_stack_fffffffffffffe58);
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_fffffffffffffe28);
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::reserve
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_fffffffffffffe68,CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60)
            );
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffe30);
  local_48 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        in_stack_fffffffffffffe30);
  while (bVar2 = __gnu_cxx::
                 operator==<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                           ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffe38,
                            (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                             *)in_stack_fffffffffffffe30), ((bVar2 ^ 0xffU) & 1) != 0) {
    puVar4 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          *)in_stack_fffffffffffffe28);
    local_58 = *puVar4;
    local_50 = local_58;
    std::__atomic_base<unsigned_long>::operator=
              ((__atomic_base<unsigned_long> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
               (__int_type_conflict)in_stack_fffffffffffffe40);
    std::
    unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
    ::get((unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
           *)in_stack_fffffffffffffe28);
    CCheckQueueControl<FakeCheckCheckCompletion>::CCheckQueueControl
              ((CCheckQueueControl<FakeCheckCheckCompletion> *)in_stack_fffffffffffffe38,
               in_stack_fffffffffffffe30);
    while (local_58 != 0) {
      std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::clear
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffe28);
      iVar3 = RandomMixin<FastRandomContext>::randrange<int>
                        ((RandomMixin<FastRandomContext> *)in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe4c);
      local_60 = (long)iVar3;
      std::min<unsigned_long>
                ((unsigned_long *)in_stack_fffffffffffffe30,
                 (unsigned_long *)in_stack_fffffffffffffe28);
      std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::resize
                ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                 (size_type)in_stack_fffffffffffffe40);
      sVar5 = std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::size
                        ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>
                          *)in_stack_fffffffffffffe28);
      local_58 = local_58 - sVar5;
      CCheckQueueControl<FakeCheckCheckCompletion>::Add
                ((CCheckQueueControl<FakeCheckCheckCompletion> *)in_stack_fffffffffffffe38,
                 (vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
                 in_stack_fffffffffffffe30);
    }
    do {
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffe68,
                 (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58,(const_string *)in_stack_fffffffffffffe50);
      CCheckQueueControl<FakeCheckCheckCompletion>::Wait(in_stack_fffffffffffffe40);
      boost::test_tools::assertion_result::assertion_result
                (in_stack_fffffffffffffe38,SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
      in_stack_fffffffffffffe68 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffe30,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_98,(lazy_ostream *)&stack0xffffffffffffff48,&local_d8,0xb1,REQUIRE,CHECK_PRED
                );
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffe28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe67 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffe67);
    do {
      in_stack_fffffffffffffe58 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                ((unit_test_log_t *)in_stack_fffffffffffffe68,
                 (const_string *)CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 (size_t)in_stack_fffffffffffffe58,(const_string *)in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe50 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffe30,(char (*) [1])in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe38 = (assertion_result *)0x1c0a206;
      in_stack_fffffffffffffe30 = (CCheckQueue<FakeCheckCheckCompletion> *)&stack0xffffffffffffffb0;
      in_stack_fffffffffffffe28 = "FakeCheckCheckCompletion::n_calls";
      boost::test_tools::tt_detail::
      check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::atomic<unsigned_long>,unsigned_long>
                (local_118,local_128,0xb2,2);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>::
      ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
                          *)in_stack_fffffffffffffe28);
      bVar2 = boost::test_tools::tt_detail::dummy_cond();
      in_stack_fffffffffffffe4c = CONCAT13(bVar2,(int3)in_stack_fffffffffffffe4c);
    } while (bVar2);
    CCheckQueueControl<FakeCheckCheckCompletion>::~CCheckQueueControl
              ((CCheckQueueControl<FakeCheckCheckCompletion> *)in_stack_fffffffffffffe38);
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)in_stack_fffffffffffffe28);
  }
  std::vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_>::~vector
            ((vector<FakeCheckCheckCompletion,_std::allocator<FakeCheckCheckCompletion>_> *)
             in_stack_fffffffffffffe38);
  std::
  unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
  ::~unique_ptr((unique_ptr<CCheckQueue<FakeCheckCheckCompletion>,_std::default_delete<CCheckQueue<FakeCheckCheckCompletion>_>_>
                 *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CheckQueueTest::Correct_Queue_range(std::vector<size_t> range)
{
    auto small_queue = std::make_unique<Correct_Queue>(QUEUE_BATCH_SIZE, SCRIPT_CHECK_THREADS);
    // Make vChecks here to save on malloc (this test can be slow...)
    std::vector<FakeCheckCheckCompletion> vChecks;
    vChecks.reserve(9);
    for (const size_t i : range) {
        size_t total = i;
        FakeCheckCheckCompletion::n_calls = 0;
        CCheckQueueControl<FakeCheckCheckCompletion> control(small_queue.get());
        while (total) {
            vChecks.clear();
            vChecks.resize(std::min<size_t>(total, m_rng.randrange(10)));
            total -= vChecks.size();
            control.Add(std::move(vChecks));
        }
        BOOST_REQUIRE(control.Wait());
        BOOST_REQUIRE_EQUAL(FakeCheckCheckCompletion::n_calls, i);
    }
}